

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float64 int64_to_float64_scalbn_x86_64(int64_t a,int scale,float_status *status)

{
  float64 fVar1;
  FloatParts p;
  
  p = int_to_float(a,scale,status);
  fVar1 = float64_round_pack_canonical(p,status);
  return fVar1;
}

Assistant:

float64 int64_to_float64_scalbn(int64_t a, int scale, float_status *status)
{
    FloatParts pa = int_to_float(a, scale, status);
    return float64_round_pack_canonical(pa, status);
}